

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  uint uVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = reader->entNr;
  uVar1 = reader->entMax;
  if (iVar2 < (int)uVar1) {
    ppxVar3 = reader->entTab;
LAB_0016d6a3:
    ppxVar3[iVar2] = value;
    reader->ent = value;
    reader->entNr = iVar2 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 10;
LAB_0016d672:
      ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(ulong)uVar5 << 3);
      if (ppxVar3 != (xmlNodePtr *)0x0) {
        reader->entTab = ppxVar3;
        reader->entMax = uVar5;
        iVar2 = reader->entNr;
        goto LAB_0016d6a3;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
      goto LAB_0016d672;
    }
    xmlTextReaderErrMemory(reader);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entNr >= reader->entMax) {
        xmlNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->entMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        tmp = xmlRealloc(reader->entTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return (-1);
        }
        reader->entTab = tmp;
        reader->entMax = newSize;
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}